

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expand.c
# Opt level: O3

int expand_pos_expression(dmr_C *C,expression *expr)

{
  byte bVar1;
  int iVar2;
  position pVar3;
  allocator *paVar4;
  expression *peVar5;
  expression *peVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  int iVar9;
  expression *peVar10;
  expression_list *ptr;
  expression_list *peVar11;
  undefined1 local_60 [8];
  ptr_list_iter entryiter__;
  
  ptr = (expr->field_5).field_11.args;
  peVar11 = ptr;
  if ((expr->field_5).field_15.idx_to == 1) {
    iVar9 = (expr->field_5).field_2.wide;
    if (*(char *)ptr == '\x18') {
      uVar7 = *(undefined4 *)&ptr->field_0x0;
      uVar8 = *(undefined4 *)&ptr->field_0x4;
      pVar3 = (position)ptr->prev_;
      peVar11 = ptr->next_;
      paVar4 = ptr->allocator_;
      peVar10 = ptr->list_[0];
      peVar5 = ptr->list_[1];
      peVar6 = ptr->list_[3];
      (expr->field_5).field_10.cond_false = ptr->list_[2];
      (expr->field_5).field_14.ident_expression = peVar6;
      (expr->field_5).field_0.value = (unsigned_long_long)peVar10;
      (expr->field_5).field_2.string = (string *)peVar5;
      expr->ctype = (symbol *)peVar11;
      *(allocator **)&expr->field_0x18 = paVar4;
      *(undefined4 *)&expr->field_0x0 = uVar7;
      expr->op = uVar8;
      expr->pos = pVar3;
      ptrlist_forward_iterator((ptr_list_iter *)local_60,(ptr_list *)(expr->field_5).field_3.unop);
      peVar10 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_60);
      peVar11 = (expression_list *)expr;
      if (peVar10 != (expression *)0x0) {
        entryiter__._16_8_ = &C->expression_allocator;
        do {
          if (*(char *)peVar10 == '\x1b') {
            (peVar10->field_5).field_2.wide = (peVar10->field_5).field_2.wide + iVar9;
          }
          else {
            if (ptr == (expression_list *)0x0) {
              pVar3 = peVar10->pos;
              ptr = (expression_list *)dmrC_allocator_allocate((allocator *)entryiter__._16_8_,0);
              bVar1 = ptr->field_0x1;
              *(char *)ptr = '\x1b';
              ptr->prev_ = (expression_list *)pVar3;
            }
            else {
              bVar1 = ptr->field_0x1;
            }
            *(ushort *)ptr = (ushort)bVar1 << 8 | 0x1b;
            ptr->next_ = (expression_list *)peVar10->ctype;
            *(int *)ptr->list_ = iVar9;
            *(undefined4 *)((long)ptr->list_ + 4) = 1;
            ptr->list_[1] = peVar10;
            ptrlist_iter_set((ptr_list_iter *)local_60,ptr);
            ptr = (expression_list *)0x0;
          }
          peVar10 = (expression *)ptrlist_iter_next((ptr_list_iter *)local_60);
        } while (peVar10 != (expression *)0x0);
      }
    }
    else if (*(char *)ptr == '\x1b') {
      iVar2 = *(int *)ptr->list_;
      uVar7 = *(undefined4 *)&ptr->field_0x0;
      uVar8 = *(undefined4 *)&ptr->field_0x4;
      pVar3 = (position)ptr->prev_;
      peVar11 = ptr->next_;
      paVar4 = ptr->allocator_;
      peVar10 = ptr->list_[1];
      peVar5 = ptr->list_[2];
      peVar6 = ptr->list_[3];
      (expr->field_5).field_0.value = (unsigned_long_long)ptr->list_[0];
      (expr->field_5).field_2.string = (string *)peVar10;
      (expr->field_5).field_10.cond_false = peVar5;
      (expr->field_5).field_14.ident_expression = peVar6;
      expr->ctype = (symbol *)peVar11;
      *(allocator **)&expr->field_0x18 = paVar4;
      *(undefined4 *)&expr->field_0x0 = uVar7;
      expr->op = uVar8;
      expr->pos = pVar3;
      (expr->field_5).field_2.wide = iVar9 + iVar2;
      peVar11 = (expression_list *)expr;
    }
  }
  iVar9 = expand_expression(C,(expression *)peVar11);
  return iVar9;
}

Assistant:

static int expand_pos_expression(struct dmr_C *C, struct expression *expr)
{
	struct expression *nested = expr->init_expr;
	unsigned long offset = expr->init_offset;
	int nr = expr->init_nr;

	if (nr == 1) {
		switch (nested->type) {
		case EXPR_POS:
			offset += nested->init_offset;
			*expr = *nested;
			expr->init_offset = offset;
			nested = expr;
			break;

		case EXPR_INITIALIZER: {
			struct expression *reuse = nested, *entry;
			*expr = *nested;
			FOR_EACH_PTR(expr->expr_list, entry) {
				if (entry->type == EXPR_POS) {
					entry->init_offset += offset;
				} else {
					if (!reuse) {
						/*
						 * This happens rarely, but it can happen
						 * with bitfields that are all at offset
						 * zero..
						 */
						reuse = dmrC_alloc_expression(C, entry->pos, EXPR_POS);
					}
					reuse->type = EXPR_POS;
					reuse->ctype = entry->ctype;
					reuse->init_offset = offset;
					reuse->init_nr = 1;
					reuse->init_expr = entry;
					REPLACE_CURRENT_PTR(struct expression *, entry, reuse);
					reuse = NULL;
				}
			} END_FOR_EACH_PTR(entry);
			nested = expr;
			break;
		}

		default:
			break;
		}
	}
	return expand_expression(C, nested);
}